

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O2

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::FinalizePsbtRequest,cfd::js::api::json::FinalizePsbtResponse,cfd::js::api::FinalizePsbtRequestStruct,cfd::js::api::FinalizePsbtResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::FinalizePsbtResponseStruct_(const_cfd::js::api::FinalizePsbtRequestStruct_&)>
          *call_function)

{
  string local_2c0;
  FinalizePsbtResponse res;
  FinalizePsbtResponseStruct response;
  FinalizePsbtRequestStruct request;
  FinalizePsbtRequest req;
  
  FinalizePsbtRequest::FinalizePsbtRequest(&req);
  core::JsonClassBase<cfd::js::api::json::FinalizePsbtRequest>::Deserialize
            (&req.super_JsonClassBase<cfd::js::api::json::FinalizePsbtRequest>,(string *)this);
  FinalizePsbtRequest::ConvertToStruct(&request,&req);
  std::
  function<cfd::js::api::FinalizePsbtResponseStruct_(const_cfd::js::api::FinalizePsbtRequestStruct_&)>
  ::operator()(&response,
               (function<cfd::js::api::FinalizePsbtResponseStruct_(const_cfd::js::api::FinalizePsbtRequestStruct_&)>
                *)request_message,&request);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (response.error.code == 0) {
    FinalizePsbtResponse::FinalizePsbtResponse(&res);
    FinalizePsbtResponse::ConvertFromStruct(&res,&response);
    core::JsonClassBase<cfd::js::api::json::FinalizePsbtResponse>::Serialize_abi_cxx11_
              (&local_2c0,&res.super_JsonClassBase<cfd::js::api::json::FinalizePsbtResponse>);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    FinalizePsbtResponse::~FinalizePsbtResponse(&res);
  }
  else {
    ErrorResponse::ConvertFromStruct((ErrorResponse *)&res,&response.error);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
              (&local_2c0,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&res);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    ErrorResponseBase::~ErrorResponseBase((ErrorResponseBase *)&res);
  }
  FinalizePsbtResponseStruct::~FinalizePsbtResponseStruct(&response);
  FinalizePsbtRequestStruct::~FinalizePsbtRequestStruct(&request);
  FinalizePsbtRequest::~FinalizePsbtRequest(&req);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}